

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

Vec_Ptr_t * Gia_ManDeriveDivs(Vec_Wrd_t *vSims,int nWords)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  uVar11 = (long)vSims->nSize / (long)nWords;
  iVar10 = (int)uVar11;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < iVar10 - 1U) {
    iVar5 = iVar10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar5 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if (0 < iVar10) {
    lVar7 = (long)nWords;
    uVar11 = uVar11 & 0xffffffff;
    lVar9 = 0;
    lVar8 = 0;
    do {
      if ((lVar9 < 0) || (lVar9 = lVar9 + lVar7, (long)vSims->nSize <= lVar9 - lVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pvVar6 = (void *)((long)vSims->pArray + lVar8);
      uVar1 = pVVar3->nSize;
      uVar2 = pVVar3->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar2 * 2;
          if (iVar5 <= (int)uVar2) goto LAB_00796e68;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = iVar5;
      }
LAB_00796e68:
      lVar8 = lVar8 + lVar7 * 8;
      uVar11 = uVar11 - 1;
      pVVar3->nSize = uVar1 + 1;
      pVVar3->pArray[(int)uVar1] = pvVar6;
    } while (uVar11 != 0);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Gia_ManDeriveDivs( Vec_Wrd_t * vSims, int nWords )
{
    int i, nDivs = Vec_WrdSize(vSims)/nWords;
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( nDivs );
    for ( i = 0; i < nDivs; i++ )
        Vec_PtrPush( vDivs, Vec_WrdEntryP(vSims, nWords*i) );
    return vDivs;
}